

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O2

int ds_list_find_index(DsList *list,void *data)

{
  int iVar1;
  DS_BOOL DVar2;
  int iVar3;
  int iVar4;
  DsListEntry *pDVar5;
  
  iVar1 = -1;
  iVar3 = iVar1;
  if (((list != (DsList *)0x0) && (list->equal != (_func_DS_BOOL_void_ptr_void_ptr *)0x0)) &&
     (pDVar5 = list->entry, pDVar5 != (DsListEntry *)0x0)) {
    iVar4 = 0;
    while ((iVar3 = iVar1, pDVar5 != (DsListEntry *)0x0 &&
           (DVar2 = (*list->equal)(data,pDVar5->data), iVar3 = iVar4, DVar2 == 0))) {
      iVar4 = iVar4 + 1;
      pDVar5 = pDVar5->next;
    }
  }
  return iVar3;
}

Assistant:

int ds_list_find_index(DsList *list, void *data)
{
    if (NULL == list || NULL == list->equal || NULL == list->entry)
        return -1;
    DsListEntry *entry = list->entry;
    int i = 0;
    while (entry)
    {
        if ((*(list->equal))(data, entry->data))
            return i;
        i++;
        entry = entry->next;
    }
    return -1;
}